

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O0

Mat * __thiscall
ncnn::ModelBinFromMatArray::load(ModelBinFromMatArray *this,int param_2,int param_3)

{
  undefined8 *puVar1;
  long in_RSI;
  Mat *in_RDI;
  Mat *m;
  
  if (**(long **)(in_RSI + 8) == 0) {
    in_RDI->data = (void *)0x0;
    in_RDI->refcount = (int *)0x0;
    in_RDI->elemsize = 0;
    in_RDI->elempack = 0;
    in_RDI->allocator = (Allocator *)0x0;
    in_RDI->dims = 0;
    in_RDI->w = 0;
    in_RDI->h = 0;
    in_RDI->d = 0;
    in_RDI->c = 0;
    in_RDI->cstep = 0;
  }
  else {
    puVar1 = (undefined8 *)**(long **)(in_RSI + 8);
    in_RDI->data = (void *)*puVar1;
    in_RDI->refcount = (int *)puVar1[1];
    in_RDI->elemsize = puVar1[2];
    in_RDI->elempack = *(int *)(puVar1 + 3);
    in_RDI->allocator = (Allocator *)puVar1[4];
    in_RDI->dims = *(int *)(puVar1 + 5);
    in_RDI->w = *(int *)((long)puVar1 + 0x2c);
    in_RDI->h = *(int *)(puVar1 + 6);
    in_RDI->d = *(int *)((long)puVar1 + 0x34);
    in_RDI->c = *(int *)(puVar1 + 7);
    in_RDI->cstep = puVar1[8];
    if (in_RDI->refcount != (int *)0x0) {
      LOCK();
      *in_RDI->refcount = *in_RDI->refcount + 1;
      UNLOCK();
    }
    **(long **)(in_RSI + 8) = **(long **)(in_RSI + 8) + 0x48;
  }
  return in_RDI;
}

Assistant:

Mat ModelBinFromMatArray::load(int /*w*/, int /*type*/) const
{
    if (!d->weights)
        return Mat();

    Mat m = d->weights[0];
    d->weights++;
    return m;
}